

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

void __thiscall
amrex::DistributionMapping::SFCProcessorMap
          (DistributionMapping *this,BoxArray *boxes,vector<long,_std::allocator<long>_> *wgts,
          int nprocs,bool sort)

{
  element_type *__new_size;
  Long LVar1;
  int in_ECX;
  vector<long,_std::allocator<long>_> *in_RDX;
  undefined8 in_RSI;
  Real *in_RDI;
  undefined1 in_R8B;
  int unaff_retaddr;
  vector<long,_std::allocator<long>_> *in_stack_00000008;
  DistributionMapping *in_stack_00000010;
  Real *in_stack_00000ba0;
  undefined1 in_stack_00000bab;
  int in_stack_00000bac;
  vector<long,_std::allocator<long>_> *in_stack_00000bb0;
  BoxArray *in_stack_00000bb8;
  DistributionMapping *in_stack_00000bc0;
  Ref *in_stack_ffffffffffffffc0;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar2;
  undefined1 sort_00;
  
  uVar2 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0) & 0x1ffffff;
  std::
  __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0xf59a5f);
  Ref::clear(in_stack_ffffffffffffffc0);
  __new_size = std::
               __shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0xf59a71);
  std::vector<long,_std::allocator<long>_>::size(in_RDX);
  sort_00 = (undefined1)((ulong)in_RDX >> 0x38);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_ECX,uVar2),(size_type)__new_size);
  LVar1 = BoxArray::size((BoxArray *)0xf59a97);
  if (LVar1 < sfc_threshold * in_ECX) {
    std::numeric_limits<int>::max();
    KnapSackProcessorMap
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,
               SUB81((ulong)in_RSI >> 0x38,0),(int)in_RSI,(bool)sort_00);
  }
  else {
    SFCProcessorMapDoIt(in_stack_00000bc0,in_stack_00000bb8,in_stack_00000bb0,in_stack_00000bac,
                        (bool)in_stack_00000bab,in_stack_00000ba0);
  }
  return;
}

Assistant:

void
DistributionMapping::SFCProcessorMap (const BoxArray&          boxes,
                                      const std::vector<Long>& wgts,
                                      int                      nprocs,
                                      bool                     sort)
{
    BL_ASSERT(boxes.size() > 0);
    BL_ASSERT(boxes.size() == static_cast<int>(wgts.size()));

    m_ref->clear();
    m_ref->m_pmap.resize(wgts.size());

    if (boxes.size() < sfc_threshold*nprocs)
    {
        KnapSackProcessorMap(wgts,nprocs);
    }
    else
    {
        SFCProcessorMapDoIt(boxes,wgts,nprocs,sort);
    }
}